

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
          (String *__return_storage_ptr__,kj *this,char **params,char *params_1,uint *params_2,
          char (*params_3) [3],char **params_4)

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  undefined1 local_79;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_58 = toCharSequence<char_const*>((char **)this);
  local_79 = *(undefined1 *)params;
  toCharSequence<unsigned_int&>(&local_48,(kj *)params_1,(uint *)local_58.size_);
  local_68 = toCharSequence<char_const(&)[3]>((char (*) [3])params_2);
  local_78 = toCharSequence<char_const*&>((char **)params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,(ArrayPtr<const_char> *)&local_79,
             (FixedArray<char,_1UL> *)&local_48,(CappedArray<char,_14UL> *)&local_68,&local_78,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}